

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::WaitForIdle(DeviceContextGLImpl *this)

{
  string msg;
  string local_30;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_Desc.IsDeferred == true) {
    FormatString<char[37]>(&local_30,(char (*) [37])"Only immediate contexts can be idled");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x633);
    std::__cxx11::string::~string((string *)&local_30);
  }
  Flush(this);
  glFinish();
  return;
}

Assistant:

void DeviceContextGLImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    glFinish();
}